

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet.c
# Opt level: O0

int pt_pkt_read_ip(pt_packet_ip *packet,uint8_t *pos,pt_config *config)

{
  byte bVar1;
  int ipsize;
  uint8_t ipc;
  uint64_t ip;
  pt_config *config_local;
  uint8_t *pos_local;
  pt_packet_ip *packet_local;
  
  if (((packet == (pt_packet_ip *)0x0) || (pos == (uint8_t *)0x0)) || (config == (pt_config *)0x0))
  {
    packet_local._4_4_ = -1;
  }
  else {
    bVar1 = *pos;
    _ipsize = 0;
    packet_local._4_4_ = pt_pkt_ip_size((int)(uint)bVar1 >> 5);
    if (-1 < packet_local._4_4_) {
      if (config->end < pos + 1 + packet_local._4_4_) {
        packet_local._4_4_ = -7;
      }
      else {
        if (packet_local._4_4_ != 0) {
          _ipsize = pt_pkt_read_value(pos + 1,packet_local._4_4_);
        }
        packet->ipc = (int)(uint)bVar1 >> 5;
        packet->ip = _ipsize;
        packet_local._4_4_ = packet_local._4_4_ + 1;
      }
    }
  }
  return packet_local._4_4_;
}

Assistant:

int pt_pkt_read_ip(struct pt_packet_ip *packet, const uint8_t *pos,
		   const struct pt_config *config)
{
	uint64_t ip;
	uint8_t ipc;
	int ipsize;

	if (!packet || !pos || !config)
		return -pte_internal;

	ipc = (*pos++ >> pt_opm_ipc_shr) & pt_opm_ipc_shr_mask;

	ip = 0ull;
	ipsize = pt_pkt_ip_size((enum pt_ip_compression) ipc);
	if (ipsize < 0)
		return ipsize;

	if (config->end < pos + ipsize)
		return -pte_eos;

	if (ipsize)
		ip = pt_pkt_read_value(pos, ipsize);

	packet->ipc = (enum pt_ip_compression) ipc;
	packet->ip = ip;

	return ipsize + 1;
}